

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.y.cpp
# Opt level: O3

int __thiscall deci::parser_t::parse(parser_t *this)

{
  pointer *ppsVar1;
  char cVar2;
  char cVar3;
  short sVar4;
  basic_symbol<deci::parser_t::by_state> *pbVar5;
  ast_item_t *paVar6;
  int iVar7;
  ostream *poVar8;
  pointer psVar9;
  ast_postfix_t *paVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  ast_arg_list_t *paVar12;
  ast_repeat_t *this_00;
  ast_item_t **ppaVar13;
  ast_t **ppaVar14;
  ast_unary_t *this_01;
  double *pdVar15;
  ast_exit_t **ppaVar16;
  ast_t *paVar17;
  ast_binary_t *paVar18;
  ast_arg_list_t **ppaVar19;
  ast_set_t *this_02;
  ast_for_t *paVar20;
  ast_if_t *paVar21;
  long lVar22;
  long lVar23;
  uint uVar24;
  value_type *pvVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  undefined1 *puVar29;
  basic_symbol<deci::parser_t::by_state> *pbVar30;
  basic_symbol<deci::parser_t::by_state> *this_03;
  char *pcVar31;
  stack_type *psVar32;
  bool bVar33;
  context yyctx;
  symbol_type yylookahead;
  symbol_type yyla;
  stack_symbol_type yyerror_range [3];
  int local_278;
  undefined1 local_270 [32];
  stack_type *local_250;
  ast_t *local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240;
  ulong local_238;
  ast_item_t *local_230;
  basic_symbol<deci::parser_t::by_kind> local_228;
  ast_t *local_1c0;
  undefined1 local_1b8 [96];
  basic_symbol<deci::parser_t::by_state> bStack_158;
  filename_type *local_b8;
  counter_type cStack_b0;
  counter_type cStack_ac;
  filename_type *local_a8;
  counter_type cStack_a0;
  counter_type cStack_9c;
  filename_type *local_58;
  counter_type cStack_50;
  counter_type cStack_4c;
  filename_type *local_48;
  counter_type cStack_40;
  counter_type cStack_3c;
  
  local_1b8._0_4_ = S_YYEMPTY;
  local_1b8._16_8_ = 0;
  local_1b8._24_8_ = 0;
  local_1b8._32_8_ = 0;
  local_1b8._40_8_ = 0;
  local_1b8._48_8_ = (type_info *)0x0;
  local_1b8._64_8_ = (filename_type *)0x0;
  local_1b8._72_4_ = 1;
  local_1b8._76_4_ = 1;
  local_1b8._80_8_ = (filename_type *)0x0;
  local_1b8._88_4_ = 1;
  local_1b8._92_4_ = 1;
  lVar23 = 0x5c;
  do {
    local_1b8[lVar23 + 4] = 0;
    *(undefined8 *)(local_1b8 + lVar23 + 0x14) = 0;
    *(undefined8 *)(local_1b8 + lVar23 + 0x1c) = 0;
    *(undefined8 *)(local_1b8 + lVar23 + 0x24) = 0;
    *(undefined8 *)(local_1b8 + lVar23 + 0x2c) = 0;
    *(undefined8 *)(local_1b8 + lVar23 + 0x34) = 0;
    *(undefined8 *)(local_1b8 + lVar23 + 0x44) = 0;
    *(undefined8 *)(local_1b8 + lVar23 + 0x4c) = 0x100000001;
    *(undefined8 *)(local_1b8 + lVar23 + 0x54) = 0;
    *(undefined8 *)(local_1b8 + lVar23 + 0x5c) = 0x100000001;
    lVar23 = lVar23 + 0x60;
  } while (lVar23 != 0x17c);
  if (this->yydebug_ != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(this->yycdebug_,"Starting parse\n",0xf);
  }
  pbVar30 = &((this->yystack_).seq_.
              super__Vector_base<deci::parser_t::stack_symbol_type,_std::allocator<deci::parser_t::stack_symbol_type>_>
              ._M_impl.super__Vector_impl_data._M_start)->
             super_basic_symbol<deci::parser_t::by_state>;
  pbVar5 = &((this->yystack_).seq_.
             super__Vector_base<deci::parser_t::stack_symbol_type,_std::allocator<deci::parser_t::stack_symbol_type>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super_basic_symbol<deci::parser_t::by_state>;
  ppsVar1 = &(this->yystack_).seq_.
             super__Vector_base<deci::parser_t::stack_symbol_type,_std::allocator<deci::parser_t::stack_symbol_type>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  this_03 = pbVar30;
  if (pbVar5 != pbVar30) {
    do {
      basic_symbol<deci::parser_t::by_state>::~basic_symbol(this_03);
      this_03 = this_03 + 1;
    } while (this_03 != pbVar5);
    *ppsVar1 = (pointer)pbVar30;
  }
  yypush_(this,(char *)0x0,'\0',(symbol_type *)local_1b8);
  local_250 = &this->yystack_;
  local_278 = 0;
  while( true ) {
    if (this->yydebug_ != 0) {
      poVar8 = this->yycdebug_;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Entering state ",0xf);
      poVar8 = (ostream *)
               std::ostream::operator<<
                         (poVar8,(int)(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.
                                      super_by_state.state);
      local_228.super_by_kind.kind_._0_1_ = S_DIV;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_228,1);
      if (this->yydebug_ != 0) {
        (*this->_vptr_parser_t[6])();
      }
    }
    lVar23 = (long)(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.super_by_state.state;
    if (lVar23 == 0x2d) break;
    sVar4 = *(short *)(yypact_ + lVar23 * 2);
    if (sVar4 == -0x14) {
LAB_0010dbfc:
      psVar9 = *ppsVar1;
      uVar24 = (uint)(char)yydefact_[psVar9[-1].super_basic_symbol<deci::parser_t::by_state>.
                                     super_by_state.state];
      if (yydefact_[psVar9[-1].super_basic_symbol<deci::parser_t::by_state>.super_by_state.state] !=
          '\0') goto LAB_0010dc1f;
LAB_0010de04:
      psVar32 = local_250;
      if (local_278 == 0) {
        local_270._8_8_ = local_1b8;
        local_270._0_8_ = this;
        (*this->_vptr_parser_t[4])(&local_228,this,local_270);
        psVar32 = local_250;
        (*this->_vptr_parser_t[3])(this,local_1b8 + 0x40,&local_228);
        if ((value_type *)CONCAT71(local_228._1_7_,(undefined1)local_228.super_by_kind.kind_) !=
            &local_228.value) {
          operator_delete((undefined1 *)
                          CONCAT71(local_228._1_7_,(undefined1)local_228.super_by_kind.kind_));
        }
        local_a8 = (filename_type *)local_1b8._80_8_;
        cStack_a0 = local_1b8._88_4_;
        cStack_9c = local_1b8._92_4_;
        local_b8 = (filename_type *)local_1b8._64_8_;
        cStack_b0 = local_1b8._72_4_;
        cStack_ac = local_1b8._76_4_;
      }
      else {
        local_a8 = (filename_type *)local_1b8._80_8_;
        cStack_a0 = local_1b8._88_4_;
        cStack_9c = local_1b8._92_4_;
        local_b8 = (filename_type *)local_1b8._64_8_;
        cStack_b0 = local_1b8._72_4_;
        cStack_ac = local_1b8._76_4_;
        if ((local_278 == 3) && (local_1b8._0_4_ != S_YYEMPTY)) {
          if (local_1b8._0_4_ != S_YYEOF) {
            yy_destroy_<deci::parser_t::by_kind>
                      (this,"Error: discarding",(basic_symbol<deci::parser_t::by_kind> *)local_1b8);
            basic_symbol<deci::parser_t::by_kind>::clear
                      ((basic_symbol<deci::parser_t::by_kind> *)local_1b8);
            goto LAB_0010eddc;
          }
          iVar7 = 1;
LAB_0010f159:
          yy_destroy_<deci::parser_t::by_kind>
                    (this,"Cleanup: discarding lookahead",
                     (basic_symbol<deci::parser_t::by_kind> *)local_1b8);
LAB_0010f170:
          if (this->yydebug_ != 0) {
            (*this->_vptr_parser_t[6])(this);
          }
          lVar23 = (long)(psVar32->seq_).
                         super__Vector_base<deci::parser_t::stack_symbol_type,_std::allocator<deci::parser_t::stack_symbol_type>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          lVar22 = (long)*ppsVar1 - lVar23;
          while (0x60 < lVar22) {
            yy_destroy_<deci::parser_t::by_state>
                      (this,"Cleanup: popping",
                       (basic_symbol<deci::parser_t::by_state> *)(lVar23 + lVar22 + -0x60));
            psVar9 = *ppsVar1;
            *ppsVar1 = (pointer)&psVar9[-1].super_basic_symbol<deci::parser_t::by_state>;
            basic_symbol<deci::parser_t::by_state>::~basic_symbol
                      (&psVar9[-1].super_basic_symbol<deci::parser_t::by_state>);
            lVar23 = (long)(psVar32->seq_).
                           super__Vector_base<deci::parser_t::stack_symbol_type,_std::allocator<deci::parser_t::stack_symbol_type>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            lVar22 = (long)*ppsVar1 - lVar23;
          }
          lVar23 = 0xc0;
          do {
            basic_symbol<deci::parser_t::by_state>::~basic_symbol
                      ((basic_symbol<deci::parser_t::by_state> *)
                       (&bStack_158.super_by_state + lVar23));
            lVar23 = lVar23 + -0x60;
          } while (lVar23 != -0x60);
          basic_symbol<deci::parser_t::by_kind>::~basic_symbol
                    ((basic_symbol<deci::parser_t::by_kind> *)local_1b8);
          return iVar7;
        }
      }
LAB_0010eddc:
      while( true ) {
        psVar9 = *ppsVar1;
        sVar4 = *(short *)(yypact_ +
                          (long)psVar9[-1].super_basic_symbol<deci::parser_t::by_state>.
                                super_by_state.state * 2);
        if ((((ushort)(sVar4 + 1U) < 0x131) && (yycheck_[(long)sVar4 + 1] == '\x01')) &&
           ('\0' < (char)yytable_[(long)sVar4 + 1])) break;
        if ((long)psVar9 -
            (long)(psVar32->seq_).
                  super__Vector_base<deci::parser_t::stack_symbol_type,_std::allocator<deci::parser_t::stack_symbol_type>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x60) {
          iVar7 = 1;
          goto LAB_0010f14f;
        }
        local_b8 = psVar9[-1].super_basic_symbol<deci::parser_t::by_state>.location.begin.filename;
        cStack_b0 = psVar9[-1].super_basic_symbol<deci::parser_t::by_state>.location.begin.line;
        cStack_ac = psVar9[-1].super_basic_symbol<deci::parser_t::by_state>.location.begin.column;
        local_a8 = psVar9[-1].super_basic_symbol<deci::parser_t::by_state>.location.end.filename;
        cStack_a0 = psVar9[-1].super_basic_symbol<deci::parser_t::by_state>.location.end.line;
        cStack_9c = psVar9[-1].super_basic_symbol<deci::parser_t::by_state>.location.end.column;
        yy_destroy_<deci::parser_t::by_state>
                  (this,"Error: popping",&psVar9[-1].super_basic_symbol<deci::parser_t::by_state>);
        pbVar30 = &(this->yystack_).seq_.
                   super__Vector_base<deci::parser_t::stack_symbol_type,_std::allocator<deci::parser_t::stack_symbol_type>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].
                   super_basic_symbol<deci::parser_t::by_state>;
        (this->yystack_).seq_.
        super__Vector_base<deci::parser_t::stack_symbol_type,_std::allocator<deci::parser_t::stack_symbol_type>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)pbVar30;
        basic_symbol<deci::parser_t::by_state>::~basic_symbol(pbVar30);
        if (this->yydebug_ != 0) {
          (*this->_vptr_parser_t[6])(this);
        }
      }
      local_228.value.field_0._16_8_ = 0;
      local_228.value.field_0._24_8_ = 0;
      local_228.value.field_0._0_8_ = (undefined1 *)0x0;
      local_228.value.field_0._8_8_ = 0;
      local_228.value.yytypeid_ = (type_info *)0x0;
      local_48 = (filename_type *)local_1b8._80_8_;
      cStack_40 = local_1b8._88_4_;
      cStack_3c = local_1b8._92_4_;
      local_58 = (filename_type *)local_1b8._64_8_;
      cStack_50 = local_1b8._72_4_;
      cStack_4c = local_1b8._76_4_;
      local_228.location.begin.filename = local_b8;
      local_228.location.begin.line = cStack_b0;
      local_228.location.begin.column = cStack_ac;
      local_228.location.end.filename = (filename_type *)local_1b8._80_8_;
      local_228.location.end.line = local_1b8._88_4_;
      local_228.location.end.column = local_1b8._92_4_;
      local_228.super_by_kind.kind_._0_1_ = yytable_[(long)sVar4 + 1];
      yypush_(this,"Shifting",(stack_symbol_type *)&local_228);
      basic_symbol<deci::parser_t::by_state>::~basic_symbol
                ((basic_symbol<deci::parser_t::by_state> *)&local_228);
      local_278 = 3;
    }
    else {
      iVar7 = this->yydebug_;
      if (local_1b8._0_4_ == S_YYEMPTY) {
        if (iVar7 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (this->yycdebug_,"Reading a token\n",0x10);
        }
        deci_scanner_t::get_next_token((symbol_type *)&local_228,this->scanner);
        basic_symbol<deci::parser_t::by_kind>::move
                  ((basic_symbol<deci::parser_t::by_kind> *)local_1b8,&local_228);
        basic_symbol<deci::parser_t::by_kind>::~basic_symbol(&local_228);
        iVar7 = this->yydebug_;
      }
      if (iVar7 != 0) {
        poVar8 = this->yycdebug_;
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Next token is",0xd);
        local_228.super_by_kind.kind_._0_1_ = S_TO;
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_228,1);
        yy_print_<deci::parser_t::by_kind>
                  (this,this->yycdebug_,(basic_symbol<deci::parser_t::by_kind> *)local_1b8);
        local_228.super_by_kind.kind_._0_1_ = S_DIV;
        std::__ostream_insert<char,std::char_traits<char>>(this->yycdebug_,(char *)&local_228,1);
      }
      if (local_1b8._0_4_ == S_YYerror) {
        local_1b8._0_4_ = S_YYUNDEF;
        psVar32 = local_250;
        goto LAB_0010eddc;
      }
      uVar24 = (int)sVar4 + local_1b8._0_4_;
      if ((0x130 < uVar24) || (local_1b8._0_4_ != (int)(char)yycheck_[uVar24])) goto LAB_0010dbfc;
      cVar2 = yytable_[uVar24];
      if (cVar2 < '\x01') {
        if (cVar2 == -1) goto LAB_0010de04;
        uVar24 = -(int)cVar2;
        psVar9 = *ppsVar1;
LAB_0010dc1f:
        pvVar25 = &local_228.value;
        local_238 = (ulong)(char)yyr2_[(int)uVar24];
        local_228.value.yytypeid_ = (type_info *)0x0;
        local_228.value.field_0._24_8_ = 0;
        local_228.value.field_0._0_8_ = (undefined1 *)0x0;
        local_228.value.field_0._8_8_ = 0;
        uVar27 = ~local_238;
        cVar2 = psVar9[uVar27].super_basic_symbol<deci::parser_t::by_state>.super_by_state.state;
        cVar3 = yyr1_[(int)uVar24];
        uVar26 = (int)(char)yydefact_[(long)cVar3 + 0x54] + (int)cVar2;
        if (((int)uVar26 < 0) || (uVar28 = (ulong)uVar26, yycheck_[uVar28] != cVar2)) {
          uVar28 = (long)cVar3 - 0x2c;
          puVar29 = yydefgoto_;
        }
        else {
          puVar29 = yytable_;
        }
        local_228.super_by_kind.kind_._0_1_ = puVar29[uVar28];
        switch(cVar3) {
        case '\x03':
          local_228.value.yytypeid_ = (type_info *)&double::typeinfo;
          break;
        case '\x04':
        case '9':
          local_228.value.yytypeid_ = (type_info *)&std::__cxx11::string::typeinfo;
          local_228.value.field_0._0_8_ = (long)&local_228.value.field_0 + 0x10;
          break;
        case '*':
        case '?':
          local_228.value.yytypeid_ = (type_info *)&ast_arg_list_t*::typeinfo;
          break;
        case '+':
        case '.':
          local_228.value.yytypeid_ = (type_info *)&ast_t*::typeinfo;
          break;
        case '/':
        case '1':
        case '2':
        case '3':
        case '4':
        case '5':
        case '6':
        case '7':
        case '8':
        case ':':
        case ';':
        case '<':
        case '=':
        case '>':
        case '@':
        case 'A':
        case 'B':
        case 'C':
        case 'D':
          local_228.value.yytypeid_ = (type_info *)&ast_item_t*::typeinfo;
          break;
        case '0':
          local_228.value.yytypeid_ = (type_info *)&ast_exit_t*::typeinfo;
        }
        local_228.value.field_0._16_8_ = 0;
        if (yyr2_[(int)uVar24] == '\0') {
          local_228.location.end.filename =
               psVar9[uVar27].super_basic_symbol<deci::parser_t::by_state>.location.end.filename;
          local_228.location.end.line =
               psVar9[uVar27].super_basic_symbol<deci::parser_t::by_state>.location.end.line;
          local_228.location.end.column =
               psVar9[uVar27].super_basic_symbol<deci::parser_t::by_state>.location.end.column;
          local_228.location.begin.filename =
               psVar9[uVar27].super_basic_symbol<deci::parser_t::by_state>.location.end.filename;
          local_228.location.begin.line =
               psVar9[uVar27].super_basic_symbol<deci::parser_t::by_state>.location.end.line;
          local_228.location.begin.column =
               psVar9[uVar27].super_basic_symbol<deci::parser_t::by_state>.location.end.column;
        }
        else {
          local_228.location.begin.filename =
               psVar9[uVar27 + 1].super_basic_symbol<deci::parser_t::by_state>.location.begin.
               filename;
          local_228.location.begin.line =
               psVar9[uVar27 + 1].super_basic_symbol<deci::parser_t::by_state>.location.begin.line;
          local_228.location.begin.column =
               psVar9[uVar27 + 1].super_basic_symbol<deci::parser_t::by_state>.location.begin.column
          ;
          local_228.location.end.filename =
               psVar9[-1].super_basic_symbol<deci::parser_t::by_state>.location.end.filename;
          local_228.location.end.line =
               psVar9[-1].super_basic_symbol<deci::parser_t::by_state>.location.end.line;
          local_228.location.end.column =
               psVar9[-1].super_basic_symbol<deci::parser_t::by_state>.location.end.column;
        }
        local_a8 = local_228.location.end.filename;
        cStack_a0 = local_228.location.end.line;
        cStack_9c = local_228.location.end.column;
        local_b8 = local_228.location.begin.filename;
        cStack_b0 = local_228.location.begin.line;
        cStack_ac = local_228.location.begin.column;
        if (this->yydebug_ != 0) {
          (*this->_vptr_parser_t[5])(this,(ulong)uVar24);
        }
        pcVar31 = "ls";
        switch(uVar24) {
        case 2:
          paVar17 = this->ast;
          ppaVar14 = value_type::as<deci::ast_t*>
                               (&(this->yystack_).seq_.
                                 super__Vector_base<deci::parser_t::stack_symbol_type,_std::allocator<deci::parser_t::stack_symbol_type>_>
                                 ._M_impl.super__Vector_impl_data._M_finish[-1].
                                 super_basic_symbol<deci::parser_t::by_state>.value);
          ast_t::Append(paVar17,&(*ppaVar14)->super_ast_item_t);
          ppaVar14 = value_type::as<deci::ast_t*>
                               (&(this->yystack_).seq_.
                                 super__Vector_base<deci::parser_t::stack_symbol_type,_std::allocator<deci::parser_t::stack_symbol_type>_>
                                 ._M_impl.super__Vector_impl_data._M_finish[-1].
                                 super_basic_symbol<deci::parser_t::by_state>.value);
          ((*ppaVar14)->super_ast_item_t).parent = &this->ast->super_ast_item_t;
          goto switchD_0010dd82_default;
        case 3:
          paVar17 = (ast_t *)operator_new(0x28);
          ast_t::ast_t(paVar17);
          ppaVar14 = value_type::as<deci::ast_t*>(pvVar25);
          *ppaVar14 = paVar17;
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.value);
          if (*ppaVar13 == (ast_item_t *)0x0) goto switchD_0010dd82_default;
          ppaVar14 = value_type::as<deci::ast_t*>(pvVar25);
          paVar17 = *ppaVar14;
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.value);
          ast_t::Append(paVar17,*ppaVar13);
LAB_0010e573:
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.value);
LAB_0010e580:
          paVar12 = (ast_arg_list_t *)*ppaVar13;
          ppaVar19 = (ast_arg_list_t **)value_type::as<deci::ast_t*>(pvVar25);
          goto LAB_0010ec9d;
        case 4:
          ppaVar14 = value_type::as<deci::ast_t*>
                               (&(*ppsVar1)[-2].super_basic_symbol<deci::parser_t::by_state>.value);
          paVar17 = *ppaVar14;
          ppaVar14 = value_type::as<deci::ast_t*>(pvVar25);
          *ppaVar14 = paVar17;
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.value);
          if (*ppaVar13 != (ast_item_t *)0x0) {
            ppaVar14 = value_type::as<deci::ast_t*>(pvVar25);
            paVar17 = *ppaVar14;
            ppaVar13 = value_type::as<deci::ast_item_t*>
                                 (&(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.value
                                 );
            ast_t::Append(paVar17,*ppaVar13);
            goto LAB_0010e573;
          }
          goto switchD_0010dd82_default;
        case 5:
          paVar17 = (ast_t *)operator_new(0x28);
          ast_t::ast_t(paVar17);
          ppaVar14 = value_type::as<deci::ast_t*>(pvVar25);
          *ppaVar14 = paVar17;
          ppaVar16 = value_type::as<deci::ast_exit_t*>
                               (&(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.value);
          if (*ppaVar16 != (ast_exit_t *)0x0) {
            ppaVar14 = value_type::as<deci::ast_t*>(pvVar25);
            paVar17 = *ppaVar14;
            ppaVar16 = value_type::as<deci::ast_exit_t*>
                                 (&(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.value
                                 );
            ast_t::Append(paVar17,&(*ppaVar16)->super_ast_item_t);
LAB_0010e469:
            ppaVar13 = (ast_item_t **)
                       value_type::as<deci::ast_exit_t*>
                                 (&(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.value
                                 );
            goto LAB_0010e580;
          }
          goto switchD_0010dd82_default;
        case 6:
          ppaVar14 = value_type::as<deci::ast_t*>
                               (&(*ppsVar1)[-2].super_basic_symbol<deci::parser_t::by_state>.value);
          paVar17 = *ppaVar14;
          ppaVar14 = value_type::as<deci::ast_t*>(pvVar25);
          *ppaVar14 = paVar17;
          ppaVar16 = value_type::as<deci::ast_exit_t*>
                               (&(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.value);
          if (*ppaVar16 != (ast_exit_t *)0x0) {
            ppaVar14 = value_type::as<deci::ast_t*>(pvVar25);
            paVar17 = *ppaVar14;
            ppaVar16 = value_type::as<deci::ast_exit_t*>
                                 (&(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.value
                                 );
            ast_t::Append(paVar17,&(*ppaVar16)->super_ast_item_t);
            goto LAB_0010e469;
          }
          goto switchD_0010dd82_default;
        case 7:
          ppaVar13 = value_type::as<deci::ast_item_t*>(pvVar25);
          *ppaVar13 = (ast_item_t *)0x0;
          goto switchD_0010dd82_default;
        case 8:
        case 9:
        case 10:
        case 0xb:
        case 0xc:
        case 0x34:
          psVar9 = *ppsVar1 + -2;
          goto LAB_0010dd99;
        case 0xd:
          paVar10 = (ast_postfix_t *)operator_new(0x10);
          ast_exit_t::ast_exit_t((ast_exit_t *)paVar10);
          ppaVar13 = (ast_item_t **)value_type::as<deci::ast_exit_t*>(pvVar25);
          goto LAB_0010dda9;
        case 0xe:
        case 0xf:
        case 0x12:
        case 0x14:
        case 0x16:
        case 0x18:
        case 0x1b:
        case 0x21:
        case 0x24:
        case 0x28:
        case 0x2a:
        case 0x2d:
          psVar9 = *ppsVar1 + -1;
LAB_0010dd99:
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(psVar9->super_basic_symbol<deci::parser_t::by_state>).value);
          paVar10 = (ast_postfix_t *)*ppaVar13;
          goto LAB_0010dda1;
        case 0x10:
          this_02 = (ast_set_t *)operator_new(0x18);
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.value);
          ast_return_t::ast_return_t((ast_return_t *)this_02,*ppaVar13);
          goto LAB_0010e9b6;
        case 0x11:
          this_02 = (ast_set_t *)operator_new(0x38);
          pbVar11 = value_type::as<std::__cxx11::string>
                              (&(*ppsVar1)[-3].super_basic_symbol<deci::parser_t::by_state>.value);
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.value);
          ast_set_t::ast_set_t(this_02,pbVar11,*ppaVar13);
LAB_0010e9b6:
          ppaVar13 = value_type::as<deci::ast_item_t*>(pvVar25);
          *ppaVar13 = &this_02->super_ast_item_t;
          goto LAB_0010e969;
        case 0x13:
          paVar18 = (ast_binary_t *)operator_new(0x40);
          local_270._0_8_ = local_270 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"or","");
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-3].super_basic_symbol<deci::parser_t::by_state>.value);
          paVar6 = *ppaVar13;
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.value);
          ast_binary_t::ast_binary_t(paVar18,(string *)local_270,paVar6,*ppaVar13);
          break;
        case 0x15:
          paVar18 = (ast_binary_t *)operator_new(0x40);
          local_270._0_8_ = local_270 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"xor","");
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-3].super_basic_symbol<deci::parser_t::by_state>.value);
          paVar6 = *ppaVar13;
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.value);
          ast_binary_t::ast_binary_t(paVar18,(string *)local_270,paVar6,*ppaVar13);
          break;
        case 0x17:
          paVar18 = (ast_binary_t *)operator_new(0x40);
          local_270._0_8_ = local_270 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"and","");
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-3].super_basic_symbol<deci::parser_t::by_state>.value);
          paVar6 = *ppaVar13;
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.value);
          ast_binary_t::ast_binary_t(paVar18,(string *)local_270,paVar6,*ppaVar13);
          break;
        case 0x19:
          paVar18 = (ast_binary_t *)operator_new(0x40);
          local_270._0_8_ = local_270 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"eq","");
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-3].super_basic_symbol<deci::parser_t::by_state>.value);
          paVar6 = *ppaVar13;
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.value);
          ast_binary_t::ast_binary_t(paVar18,(string *)local_270,paVar6,*ppaVar13);
          break;
        case 0x1a:
          paVar18 = (ast_binary_t *)operator_new(0x40);
          local_270._0_8_ = local_270 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"neq","");
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-3].super_basic_symbol<deci::parser_t::by_state>.value);
          paVar6 = *ppaVar13;
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.value);
          ast_binary_t::ast_binary_t(paVar18,(string *)local_270,paVar6,*ppaVar13);
          break;
        case 0x1c:
          paVar18 = (ast_binary_t *)operator_new(0x40);
          pbVar11 = value_type::as<std::__cxx11::string>
                              (&(*ppsVar1)[-2].super_basic_symbol<deci::parser_t::by_state>.value);
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-3].super_basic_symbol<deci::parser_t::by_state>.value);
          paVar6 = *ppaVar13;
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.value);
          ast_binary_t::ast_binary_t(paVar18,pbVar11,paVar6,*ppaVar13);
          ppaVar13 = value_type::as<deci::ast_item_t*>(&local_228.value);
          *ppaVar13 = (ast_item_t *)paVar18;
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-3].super_basic_symbol<deci::parser_t::by_state>.value);
          paVar6 = *ppaVar13;
          ppaVar13 = value_type::as<deci::ast_item_t*>(&local_228.value);
          paVar6->parent = *ppaVar13;
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.value);
          paVar12 = (ast_arg_list_t *)*ppaVar13;
          goto LAB_0010ec98;
        case 0x1d:
          goto switchD_0010dd82_caseD_1d;
        case 0x1e:
          pcVar31 = "gr";
          goto switchD_0010dd82_caseD_1d;
        case 0x1f:
          pcVar31 = "le";
          goto switchD_0010dd82_caseD_1d;
        case 0x20:
          pcVar31 = "ge";
switchD_0010dd82_caseD_1d:
          pbVar11 = value_type::as<std::__cxx11::string>(pvVar25);
          std::__cxx11::string::operator=((string *)pbVar11,pcVar31);
          goto switchD_0010dd82_default;
        case 0x22:
          paVar18 = (ast_binary_t *)operator_new(0x40);
          local_270._0_8_ = local_270 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"sum","");
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-3].super_basic_symbol<deci::parser_t::by_state>.value);
          paVar6 = *ppaVar13;
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.value);
          ast_binary_t::ast_binary_t(paVar18,(string *)local_270,paVar6,*ppaVar13);
          break;
        case 0x23:
          paVar18 = (ast_binary_t *)operator_new(0x40);
          local_270._0_8_ = local_270 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"sub","");
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-3].super_basic_symbol<deci::parser_t::by_state>.value);
          paVar6 = *ppaVar13;
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.value);
          ast_binary_t::ast_binary_t(paVar18,(string *)local_270,paVar6,*ppaVar13);
          break;
        case 0x25:
          paVar18 = (ast_binary_t *)operator_new(0x40);
          local_270._0_8_ = local_270 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"mul","");
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-3].super_basic_symbol<deci::parser_t::by_state>.value);
          paVar6 = *ppaVar13;
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.value);
          ast_binary_t::ast_binary_t(paVar18,(string *)local_270,paVar6,*ppaVar13);
          break;
        case 0x26:
          paVar18 = (ast_binary_t *)operator_new(0x40);
          local_270._0_8_ = local_270 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"mod","");
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-3].super_basic_symbol<deci::parser_t::by_state>.value);
          paVar6 = *ppaVar13;
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.value);
          ast_binary_t::ast_binary_t(paVar18,(string *)local_270,paVar6,*ppaVar13);
          break;
        case 0x27:
          paVar18 = (ast_binary_t *)operator_new(0x40);
          local_270._0_8_ = local_270 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"div","");
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-3].super_basic_symbol<deci::parser_t::by_state>.value);
          paVar6 = *ppaVar13;
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.value);
          ast_binary_t::ast_binary_t(paVar18,(string *)local_270,paVar6,*ppaVar13);
          break;
        case 0x29:
          paVar18 = (ast_binary_t *)operator_new(0x40);
          local_270._0_8_ = local_270 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"pow","");
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-3].super_basic_symbol<deci::parser_t::by_state>.value);
          paVar6 = *ppaVar13;
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.value);
          ast_binary_t::ast_binary_t(paVar18,(string *)local_270,paVar6,*ppaVar13);
          break;
        case 0x2b:
          this_01 = (ast_unary_t *)operator_new(0x38);
          local_270._0_8_ = local_270 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"not","");
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.value);
          ast_unary_t::ast_unary_t(this_01,(string *)local_270,*ppaVar13);
          goto LAB_0010e1f3;
        case 0x2c:
          this_01 = (ast_unary_t *)operator_new(0x38);
          local_270._0_8_ = local_270 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"neg","");
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.value);
          ast_unary_t::ast_unary_t(this_01,(string *)local_270,*ppaVar13);
LAB_0010e1f3:
          ppaVar13 = value_type::as<deci::ast_item_t*>(pvVar25);
          *ppaVar13 = &this_01->super_ast_item_t;
          if ((parser_t *)local_270._0_8_ != (parser_t *)(local_270 + 0x10)) {
            operator_delete((void *)local_270._0_8_);
          }
          goto LAB_0010e969;
        case 0x2e:
          paVar10 = (ast_postfix_t *)operator_new(0x38);
          pbVar11 = value_type::as<std::__cxx11::string>
                              (&(*ppsVar1)[-3].super_basic_symbol<deci::parser_t::by_state>.value);
          ast_postfix_t::ast_postfix_t(paVar10,pbVar11,(ast_arg_list_t *)0x0);
          goto LAB_0010dda1;
        case 0x2f:
          paVar10 = (ast_postfix_t *)operator_new(0x38);
          pbVar11 = value_type::as<std::__cxx11::string>
                              (&(*ppsVar1)[-4].super_basic_symbol<deci::parser_t::by_state>.value);
          ppaVar19 = value_type::as<deci::ast_arg_list_t*>
                               (&(*ppsVar1)[-2].super_basic_symbol<deci::parser_t::by_state>.value);
          ast_postfix_t::ast_postfix_t(paVar10,pbVar11,*ppaVar19);
          ppaVar13 = value_type::as<deci::ast_item_t*>(pvVar25);
          *ppaVar13 = (ast_item_t *)paVar10;
          ppaVar19 = value_type::as<deci::ast_arg_list_t*>
                               (&(*ppsVar1)[-2].super_basic_symbol<deci::parser_t::by_state>.value);
          goto LAB_0010ec92;
        case 0x30:
          paVar12 = (ast_arg_list_t *)operator_new(0x28);
          ast_arg_list_t::ast_arg_list_t(paVar12);
          ppaVar19 = value_type::as<deci::ast_arg_list_t*>(pvVar25);
          *ppaVar19 = paVar12;
          ppaVar19 = value_type::as<deci::ast_arg_list_t*>(pvVar25);
          paVar12 = *ppaVar19;
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.value);
          ast_arg_list_t::Append(paVar12,*ppaVar13);
          goto LAB_0010e25c;
        case 0x31:
          ppaVar19 = value_type::as<deci::ast_arg_list_t*>
                               (&(*ppsVar1)[-3].super_basic_symbol<deci::parser_t::by_state>.value);
          paVar12 = *ppaVar19;
          ppaVar19 = value_type::as<deci::ast_arg_list_t*>(pvVar25);
          *ppaVar19 = paVar12;
          ppaVar19 = value_type::as<deci::ast_arg_list_t*>(pvVar25);
          paVar12 = *ppaVar19;
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.value);
          ast_arg_list_t::Append(paVar12,*ppaVar13);
LAB_0010e25c:
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.value);
          paVar12 = (ast_arg_list_t *)*ppaVar13;
          ppaVar19 = value_type::as<deci::ast_arg_list_t*>(pvVar25);
          goto LAB_0010ec9d;
        case 0x32:
          paVar10 = (ast_postfix_t *)operator_new(0x18);
          pdVar15 = value_type::as<double>
                              (&(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.value);
          ast_number_t::ast_number_t((ast_number_t *)paVar10,*pdVar15);
          goto LAB_0010dda1;
        case 0x33:
          paVar10 = (ast_postfix_t *)operator_new(0x30);
          pbVar11 = value_type::as<std::__cxx11::string>
                              (&(*ppsVar1)[-1].super_basic_symbol<deci::parser_t::by_state>.value);
          ast_identifier_t::ast_identifier_t((ast_identifier_t *)paVar10,pbVar11);
LAB_0010dda1:
          ppaVar13 = value_type::as<deci::ast_item_t*>(pvVar25);
LAB_0010dda9:
          *ppaVar13 = &paVar10->super_ast_item_t;
          goto switchD_0010dd82_default;
        case 0x35:
          paVar21 = (ast_if_t *)operator_new(0x28);
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-6].super_basic_symbol<deci::parser_t::by_state>.value);
          local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*ppaVar13
          ;
          ppaVar14 = value_type::as<deci::ast_t*>
                               (&(*ppsVar1)[-4].super_basic_symbol<deci::parser_t::by_state>.value);
          local_248 = *ppaVar14;
          ppaVar14 = value_type::as<deci::ast_t*>
                               (&(*ppsVar1)[-2].super_basic_symbol<deci::parser_t::by_state>.value);
          ast_if_t::ast_if_t(paVar21,(ast_item_t *)local_240,local_248,*ppaVar14);
          pvVar25 = &local_228.value;
          ppaVar13 = value_type::as<deci::ast_item_t*>(pvVar25);
          *ppaVar13 = (ast_item_t *)paVar21;
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-6].super_basic_symbol<deci::parser_t::by_state>.value);
          paVar6 = *ppaVar13;
          ppaVar13 = value_type::as<deci::ast_item_t*>(pvVar25);
          paVar6->parent = *ppaVar13;
          ppaVar14 = value_type::as<deci::ast_t*>
                               (&(*ppsVar1)[-4].super_basic_symbol<deci::parser_t::by_state>.value);
          paVar17 = *ppaVar14;
          ppaVar13 = value_type::as<deci::ast_item_t*>(pvVar25);
          (paVar17->super_ast_item_t).parent = *ppaVar13;
          goto LAB_0010ec82;
        case 0x36:
          paVar21 = (ast_if_t *)operator_new(0x28);
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-4].super_basic_symbol<deci::parser_t::by_state>.value);
          paVar6 = *ppaVar13;
          ppaVar14 = value_type::as<deci::ast_t*>
                               (&(*ppsVar1)[-2].super_basic_symbol<deci::parser_t::by_state>.value);
          ast_if_t::ast_if_t(paVar21,paVar6,*ppaVar14,(ast_t *)0x0);
          goto LAB_0010eb2e;
        case 0x37:
          paVar20 = (ast_for_t *)operator_new(0x58);
          local_240 = value_type::as<std::__cxx11::string>
                                (&(*ppsVar1)[-10].super_basic_symbol<deci::parser_t::by_state>.value
                                );
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-8].super_basic_symbol<deci::parser_t::by_state>.value);
          local_248 = (ast_t *)*ppaVar13;
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-6].super_basic_symbol<deci::parser_t::by_state>.value);
          local_230 = *ppaVar13;
          ppaVar14 = value_type::as<deci::ast_t*>
                               (&(*ppsVar1)[-2].super_basic_symbol<deci::parser_t::by_state>.value);
          local_1c0 = *ppaVar14;
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-4].super_basic_symbol<deci::parser_t::by_state>.value);
          ast_for_t::ast_for_t
                    (paVar20,local_240,&local_248->super_ast_item_t,local_230,local_1c0,*ppaVar13);
          ppaVar13 = value_type::as<deci::ast_item_t*>(&local_228.value);
          *ppaVar13 = (ast_item_t *)paVar20;
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-8].super_basic_symbol<deci::parser_t::by_state>.value);
          paVar6 = *ppaVar13;
          ppaVar13 = value_type::as<deci::ast_item_t*>(&local_228.value);
          paVar6->parent = *ppaVar13;
          psVar9 = *ppsVar1;
          goto LAB_0010ea68;
        case 0x38:
          paVar20 = (ast_for_t *)operator_new(0x58);
          local_240 = value_type::as<std::__cxx11::string>
                                (&(*ppsVar1)[-8].super_basic_symbol<deci::parser_t::by_state>.value)
          ;
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-6].super_basic_symbol<deci::parser_t::by_state>.value);
          local_248 = (ast_t *)*ppaVar13;
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-4].super_basic_symbol<deci::parser_t::by_state>.value);
          local_230 = *ppaVar13;
          ppaVar14 = value_type::as<deci::ast_t*>
                               (&(*ppsVar1)[-2].super_basic_symbol<deci::parser_t::by_state>.value);
          ast_for_t::ast_for_t
                    (paVar20,local_240,&local_248->super_ast_item_t,local_230,*ppaVar14,
                     (ast_item_t *)0x0);
          ppaVar13 = value_type::as<deci::ast_item_t*>(&local_228.value);
          *ppaVar13 = (ast_item_t *)paVar20;
          psVar9 = *ppsVar1;
LAB_0010ea68:
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&psVar9[-6].super_basic_symbol<deci::parser_t::by_state>.value);
          paVar6 = *ppaVar13;
          ppaVar13 = value_type::as<deci::ast_item_t*>(&local_228.value);
          paVar6->parent = *ppaVar13;
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-4].super_basic_symbol<deci::parser_t::by_state>.value);
          paVar6 = *ppaVar13;
          ppaVar13 = value_type::as<deci::ast_item_t*>(&local_228.value);
          paVar6->parent = *ppaVar13;
LAB_0010ec82:
          psVar9 = *ppsVar1;
          goto LAB_0010ec8d;
        case 0x39:
          paVar21 = (ast_if_t *)operator_new(0x28);
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-4].super_basic_symbol<deci::parser_t::by_state>.value);
          paVar6 = *ppaVar13;
          ppaVar14 = value_type::as<deci::ast_t*>
                               (&(*ppsVar1)[-2].super_basic_symbol<deci::parser_t::by_state>.value);
          ast_while_t::ast_while_t((ast_while_t *)paVar21,paVar6,*ppaVar14);
LAB_0010eb2e:
          ppaVar13 = value_type::as<deci::ast_item_t*>(&local_228.value);
          *ppaVar13 = &paVar21->super_ast_item_t;
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-4].super_basic_symbol<deci::parser_t::by_state>.value);
          paVar6 = *ppaVar13;
          ppaVar13 = value_type::as<deci::ast_item_t*>(&local_228.value);
          paVar6->parent = *ppaVar13;
          psVar9 = *ppsVar1;
LAB_0010ec8d:
          ppaVar19 = (ast_arg_list_t **)
                     value_type::as<deci::ast_t*>
                               (&psVar9[-2].super_basic_symbol<deci::parser_t::by_state>.value);
          goto LAB_0010ec92;
        case 0x3a:
          this_00 = (ast_repeat_t *)operator_new(0x28);
          ppaVar13 = value_type::as<deci::ast_item_t*>
                               (&(*ppsVar1)[-2].super_basic_symbol<deci::parser_t::by_state>.value);
          paVar6 = *ppaVar13;
          ppaVar14 = value_type::as<deci::ast_t*>
                               (&(*ppsVar1)[-4].super_basic_symbol<deci::parser_t::by_state>.value);
          ast_repeat_t::ast_repeat_t(this_00,paVar6,*ppaVar14);
          ppaVar13 = value_type::as<deci::ast_item_t*>(&local_228.value);
          *ppaVar13 = (ast_item_t *)this_00;
          ppaVar14 = value_type::as<deci::ast_t*>
                               (&(*ppsVar1)[-4].super_basic_symbol<deci::parser_t::by_state>.value);
          paVar17 = *ppaVar14;
          ppaVar13 = value_type::as<deci::ast_item_t*>(&local_228.value);
          (paVar17->super_ast_item_t).parent = *ppaVar13;
          psVar9 = *ppsVar1 + -2;
          goto LAB_0010e971;
        default:
          goto switchD_0010dd82_default;
        }
        ppaVar13 = value_type::as<deci::ast_item_t*>(pvVar25);
        *ppaVar13 = &paVar18->super_ast_item_t;
        if ((parser_t *)local_270._0_8_ != (parser_t *)(local_270 + 0x10)) {
          operator_delete((void *)local_270._0_8_);
        }
        ppaVar13 = value_type::as<deci::ast_item_t*>
                             (&(*ppsVar1)[-3].super_basic_symbol<deci::parser_t::by_state>.value);
        paVar6 = *ppaVar13;
        ppaVar13 = value_type::as<deci::ast_item_t*>(pvVar25);
        paVar6->parent = *ppaVar13;
LAB_0010e969:
        psVar9 = *ppsVar1 + -1;
LAB_0010e971:
        ppaVar19 = (ast_arg_list_t **)
                   value_type::as<deci::ast_item_t*>
                             (&(psVar9->super_basic_symbol<deci::parser_t::by_state>).value);
LAB_0010ec92:
        paVar12 = *ppaVar19;
LAB_0010ec98:
        ppaVar19 = (ast_arg_list_t **)value_type::as<deci::ast_item_t*>(&local_228.value);
LAB_0010ec9d:
        (paVar12->super_ast_item_t).parent = &(*ppaVar19)->super_ast_item_t;
switchD_0010dd82_default:
        if (this->yydebug_ != 0) {
          poVar8 = this->yycdebug_;
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"-> $$ =",7);
          local_270[0] = (string)0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_270,1);
          yy_print_<deci::parser_t::by_state>
                    (this,this->yycdebug_,(basic_symbol<deci::parser_t::by_state> *)&local_228);
          local_270[0] = (string)0xa;
          std::__ostream_insert<char,std::char_traits<char>>(this->yycdebug_,local_270,1);
        }
        if ('\0' < (char)local_238) {
          uVar27 = (local_238 & 0xffffffff) + 1;
          do {
            psVar9 = *ppsVar1;
            *ppsVar1 = (pointer)&psVar9[-1].super_basic_symbol<deci::parser_t::by_state>;
            basic_symbol<deci::parser_t::by_state>::~basic_symbol
                      (&psVar9[-1].super_basic_symbol<deci::parser_t::by_state>);
            uVar27 = uVar27 - 1;
          } while (1 < uVar27);
        }
        stack<deci::parser_t::stack_symbol_type,_std::vector<deci::parser_t::stack_symbol_type,_std::allocator<deci::parser_t::stack_symbol_type>_>_>
        ::push(local_250,(stack_symbol_type *)&local_228);
        basic_symbol<deci::parser_t::by_state>::~basic_symbol
                  ((basic_symbol<deci::parser_t::by_state> *)&local_228);
      }
      else {
        bVar33 = local_278 == 0;
        local_278 = local_278 + -1;
        if (bVar33) {
          local_278 = 0;
        }
        yypush_(this,"Shifting",cVar2,(symbol_type *)local_1b8);
      }
    }
  }
  iVar7 = 0;
  psVar32 = local_250;
LAB_0010f14f:
  if (local_1b8._0_4_ != S_YYEMPTY) goto LAB_0010f159;
  goto LAB_0010f170;
}

Assistant:

int
   parser_t ::parse ()
  {
    int yyn;
    /// Length of the RHS of the rule being reduced.
    int yylen = 0;

    // Error handling.
    int yynerrs_ = 0;
    int yyerrstatus_ = 0;

    /// The lookahead symbol.
    symbol_type yyla;

    /// The locations where the error started and ended.
    stack_symbol_type yyerror_range[3];

    /// The return value of parse ().
    int yyresult;

#if YY_EXCEPTIONS
    try
#endif // YY_EXCEPTIONS
      {
    YYCDEBUG << "Starting parse\n";


    /* Initialize the stack.  The initial state will be set in
       yynewstate, since the latter expects the semantical and the
       location values to have been already stored, initialize these
       stacks with a primary value.  */
    yystack_.clear ();
    yypush_ (YY_NULLPTR, 0, YY_MOVE (yyla));

  /*-----------------------------------------------.
  | yynewstate -- push a new symbol on the stack.  |
  `-----------------------------------------------*/
  yynewstate:
    YYCDEBUG << "Entering state " << int (yystack_[0].state) << '\n';
    YY_STACK_PRINT ();

    // Accept?
    if (yystack_[0].state == yyfinal_)
      YYACCEPT;

    goto yybackup;


  /*-----------.
  | yybackup.  |
  `-----------*/
  yybackup:
    // Try to take a decision without lookahead.
    yyn = yypact_[+yystack_[0].state];
    if (yy_pact_value_is_default_ (yyn))
      goto yydefault;

    // Read a lookahead token.
    if (yyla.empty ())
      {
        YYCDEBUG << "Reading a token\n";
#if YY_EXCEPTIONS
        try
#endif // YY_EXCEPTIONS
          {
            symbol_type yylookahead (yylex (scanner));
            yyla.move (yylookahead);
          }
#if YY_EXCEPTIONS
        catch (const syntax_error& yyexc)
          {
            YYCDEBUG << "Caught exception: " << yyexc.what() << '\n';
            error (yyexc);
            goto yyerrlab1;
          }
#endif // YY_EXCEPTIONS
      }
    YY_SYMBOL_PRINT ("Next token is", yyla);

    if (yyla.kind () == symbol_kind::S_YYerror)
    {
      // The scanner already issued an error message, process directly
      // to error recovery.  But do not keep the error token as
      // lookahead, it is too special and may lead us to an endless
      // loop in error recovery. */
      yyla.kind_ = symbol_kind::S_YYUNDEF;
      goto yyerrlab1;
    }

    /* If the proper action on seeing token YYLA.TYPE is to reduce or
       to detect an error, take that action.  */
    yyn += yyla.kind ();
    if (yyn < 0 || yylast_ < yyn || yycheck_[yyn] != yyla.kind ())
      {
        goto yydefault;
      }

    // Reduce or error.
    yyn = yytable_[yyn];
    if (yyn <= 0)
      {
        if (yy_table_value_is_error_ (yyn))
          goto yyerrlab;
        yyn = -yyn;
        goto yyreduce;
      }

    // Count tokens shifted since error; after three, turn off error status.
    if (yyerrstatus_)
      --yyerrstatus_;

    // Shift the lookahead token.
    yypush_ ("Shifting", state_type (yyn), YY_MOVE (yyla));
    goto yynewstate;


  /*-----------------------------------------------------------.
  | yydefault -- do the default action for the current state.  |
  `-----------------------------------------------------------*/
  yydefault:
    yyn = yydefact_[+yystack_[0].state];
    if (yyn == 0)
      goto yyerrlab;
    goto yyreduce;


  /*-----------------------------.
  | yyreduce -- do a reduction.  |
  `-----------------------------*/
  yyreduce:
    yylen = yyr2_[yyn];
    {
      stack_symbol_type yylhs;
      yylhs.state = yy_lr_goto_state_ (yystack_[yylen].state, yyr1_[yyn]);
      /* Variants are always initialized to an empty instance of the
         correct type. The default '$$ = $1' action is NOT applied
         when using variants.  */
      switch (yyr1_[yyn])
    {
      case symbol_kind::S_42_argument_list_: // "argument list"
      case symbol_kind::S_argument_list: // argument_list
        yylhs.value.emplace< ast_arg_list_t* > ();
        break;

      case symbol_kind::S_exit_statement: // exit_statement
        yylhs.value.emplace< ast_exit_t* > ();
        break;

      case symbol_kind::S_statement: // statement
      case symbol_kind::S_expression_statement: // expression_statement
      case symbol_kind::S_expression: // expression
      case symbol_kind::S_assign_expr: // assign_expr
      case symbol_kind::S_or_expr: // or_expr
      case symbol_kind::S_xor_expr: // xor_expr
      case symbol_kind::S_and_expr: // and_expr
      case symbol_kind::S_eql_expr: // eql_expr
      case symbol_kind::S_cmp_expr: // cmp_expr
      case symbol_kind::S_add_expr: // add_expr
      case symbol_kind::S_mul_expr: // mul_expr
      case symbol_kind::S_pow_expr: // pow_expr
      case symbol_kind::S_unary_expr: // unary_expr
      case symbol_kind::S_postfix_expr: // postfix_expr
      case symbol_kind::S_primary_expr: // primary_expr
      case symbol_kind::S_if_statement: // if_statement
      case symbol_kind::S_for_statement: // for_statement
      case symbol_kind::S_while_statement: // while_statement
      case symbol_kind::S_repeat_statement: // repeat_statement
        yylhs.value.emplace< ast_item_t* > ();
        break;

      case symbol_kind::S_43_statement_list_: // "statement list"
      case symbol_kind::S_statement_list: // statement_list
        yylhs.value.emplace< ast_t* > ();
        break;

      case symbol_kind::S_NUMBER: // "number"
        yylhs.value.emplace< double > ();
        break;

      case symbol_kind::S_IDENTIFIER: // "identifier"
      case symbol_kind::S_CMP_OPERATOR: // CMP_OPERATOR
        yylhs.value.emplace< std::string > ();
        break;

      default:
        break;
    }


      // Default location.
      {
        stack_type::slice range (yystack_, yylen);
        YYLLOC_DEFAULT (yylhs.location, range, yylen);
        yyerror_range[1].location = yylhs.location;
      }

      // Perform the reduction.
      YY_REDUCE_PRINT (yyn);
#if YY_EXCEPTIONS
      try
#endif // YY_EXCEPTIONS
        {
          switch (yyn)
            {
  case 2: // entry: statement_list
#line 100 "src/iec61131.y"
                                       { ast.Append(yystack_[0].value.as < ast_t* > ()); yystack_[0].value.as < ast_t* > ()->Parent(&ast); }
#line 768 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 3: // statement_list: statement
#line 104 "src/iec61131.y"
                                   { yylhs.value.as < ast_t* > () = new ast_t(); if (yystack_[0].value.as < ast_item_t* > () != nullptr) { yylhs.value.as < ast_t* > ()->Append(yystack_[0].value.as < ast_item_t* > ()); yystack_[0].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_t* > ()); } }
#line 774 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 4: // statement_list: statement_list statement
#line 105 "src/iec61131.y"
                                   { yylhs.value.as < ast_t* > () = yystack_[1].value.as < ast_t* > ();          if (yystack_[0].value.as < ast_item_t* > () != nullptr) { yylhs.value.as < ast_t* > ()->Append(yystack_[0].value.as < ast_item_t* > ()); yystack_[0].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_t* > ()); } }
#line 780 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 5: // statement_list: exit_statement
#line 106 "src/iec61131.y"
                                   { yylhs.value.as < ast_t* > () = new ast_t(); if (yystack_[0].value.as < ast_exit_t* > () != nullptr) { yylhs.value.as < ast_t* > ()->Append(yystack_[0].value.as < ast_exit_t* > ()); yystack_[0].value.as < ast_exit_t* > ()->Parent(yylhs.value.as < ast_t* > ()); } }
#line 786 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 6: // statement_list: statement_list exit_statement
#line 107 "src/iec61131.y"
                                   { yylhs.value.as < ast_t* > () = yystack_[1].value.as < ast_t* > ();          if (yystack_[0].value.as < ast_exit_t* > () != nullptr) { yylhs.value.as < ast_t* > ()->Append(yystack_[0].value.as < ast_exit_t* > ()); yystack_[0].value.as < ast_exit_t* > ()->Parent(yylhs.value.as < ast_t* > ()); } }
#line 792 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 7: // statement: ";"
#line 111 "src/iec61131.y"
                             { yylhs.value.as < ast_item_t* > () = nullptr;          }
#line 798 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 8: // statement: expression_statement ";"
#line 112 "src/iec61131.y"
                             { yylhs.value.as < ast_item_t* > () = yystack_[1].value.as < ast_item_t* > ();               }
#line 804 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 9: // statement: if_statement ";"
#line 113 "src/iec61131.y"
                             { yylhs.value.as < ast_item_t* > () = yystack_[1].value.as < ast_item_t* > ();               }
#line 810 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 10: // statement: for_statement ";"
#line 114 "src/iec61131.y"
                             { yylhs.value.as < ast_item_t* > () = yystack_[1].value.as < ast_item_t* > ();               }
#line 816 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 11: // statement: while_statement ";"
#line 115 "src/iec61131.y"
                             { yylhs.value.as < ast_item_t* > () = yystack_[1].value.as < ast_item_t* > ();               }
#line 822 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 12: // statement: repeat_statement ";"
#line 116 "src/iec61131.y"
                             { yylhs.value.as < ast_item_t* > () = yystack_[1].value.as < ast_item_t* > ();               }
#line 828 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 13: // exit_statement: "EXIT" ";"
#line 120 "src/iec61131.y"
                             { yylhs.value.as < ast_exit_t* > () = new ast_exit_t(); }
#line 834 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 14: // expression_statement: expression
#line 124 "src/iec61131.y"
                             { yylhs.value.as < ast_item_t* > () = yystack_[0].value.as < ast_item_t* > (); }
#line 840 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 15: // expression: assign_expr
#line 128 "src/iec61131.y"
                             { yylhs.value.as < ast_item_t* > () = yystack_[0].value.as < ast_item_t* > (); }
#line 846 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 16: // assign_expr: or_expr
#line 132 "src/iec61131.y"
                             { yylhs.value.as < ast_item_t* > () = new ast_return_t(yystack_[0].value.as < ast_item_t* > ());  yystack_[0].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); }
#line 852 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 17: // assign_expr: "identifier" ":=" or_expr
#line 133 "src/iec61131.y"
                             { yylhs.value.as < ast_item_t* > () = new ast_set_t(yystack_[2].value.as < std::string > (), yystack_[0].value.as < ast_item_t* > ()); yystack_[0].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); }
#line 858 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 18: // or_expr: xor_expr
#line 137 "src/iec61131.y"
                              { yylhs.value.as < ast_item_t* > () = yystack_[0].value.as < ast_item_t* > (); }
#line 864 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 19: // or_expr: or_expr "or" xor_expr
#line 138 "src/iec61131.y"
                              { yylhs.value.as < ast_item_t* > () = new ast_binary_t("or", yystack_[2].value.as < ast_item_t* > (), yystack_[0].value.as < ast_item_t* > ()); yystack_[2].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); yystack_[0].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); }
#line 870 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 20: // xor_expr: and_expr
#line 142 "src/iec61131.y"
                              { yylhs.value.as < ast_item_t* > () = yystack_[0].value.as < ast_item_t* > (); }
#line 876 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 21: // xor_expr: xor_expr "xor" and_expr
#line 143 "src/iec61131.y"
                              { yylhs.value.as < ast_item_t* > () = new ast_binary_t("xor", yystack_[2].value.as < ast_item_t* > (), yystack_[0].value.as < ast_item_t* > ()); yystack_[2].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); yystack_[0].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); }
#line 882 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 22: // and_expr: eql_expr
#line 147 "src/iec61131.y"
                              { yylhs.value.as < ast_item_t* > () = yystack_[0].value.as < ast_item_t* > (); }
#line 888 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 23: // and_expr: and_expr "and" eql_expr
#line 148 "src/iec61131.y"
                              { yylhs.value.as < ast_item_t* > () = new ast_binary_t("and", yystack_[2].value.as < ast_item_t* > (), yystack_[0].value.as < ast_item_t* > ()); yystack_[2].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); yystack_[0].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); }
#line 894 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 24: // eql_expr: cmp_expr
#line 152 "src/iec61131.y"
                              { yylhs.value.as < ast_item_t* > () = yystack_[0].value.as < ast_item_t* > (); }
#line 900 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 25: // eql_expr: eql_expr "=" cmp_expr
#line 153 "src/iec61131.y"
                              { yylhs.value.as < ast_item_t* > () = new ast_binary_t("eq", yystack_[2].value.as < ast_item_t* > (), yystack_[0].value.as < ast_item_t* > ()); yystack_[2].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); yystack_[0].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); }
#line 906 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 26: // eql_expr: eql_expr "<>" cmp_expr
#line 154 "src/iec61131.y"
                              { yylhs.value.as < ast_item_t* > () = new ast_binary_t("neq", yystack_[2].value.as < ast_item_t* > (), yystack_[0].value.as < ast_item_t* > ()); yystack_[2].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); yystack_[0].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); }
#line 912 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 27: // cmp_expr: add_expr
#line 158 "src/iec61131.y"
                                   { yylhs.value.as < ast_item_t* > () = yystack_[0].value.as < ast_item_t* > (); }
#line 918 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 28: // cmp_expr: cmp_expr CMP_OPERATOR add_expr
#line 159 "src/iec61131.y"
                                   { yylhs.value.as < ast_item_t* > () = new ast_binary_t(yystack_[1].value.as < std::string > (), yystack_[2].value.as < ast_item_t* > (), yystack_[0].value.as < ast_item_t* > ()); yystack_[2].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); yystack_[0].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ());  }
#line 924 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 29: // CMP_OPERATOR: "<"
#line 163 "src/iec61131.y"
         { yylhs.value.as < std::string > () = "ls"; }
#line 930 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 30: // CMP_OPERATOR: ">"
#line 164 "src/iec61131.y"
         { yylhs.value.as < std::string > () = "gr"; }
#line 936 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 31: // CMP_OPERATOR: "<="
#line 165 "src/iec61131.y"
         { yylhs.value.as < std::string > () = "le"; }
#line 942 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 32: // CMP_OPERATOR: ">="
#line 166 "src/iec61131.y"
         { yylhs.value.as < std::string > () = "ge"; }
#line 948 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 33: // add_expr: mul_expr
#line 169 "src/iec61131.y"
                              { yylhs.value.as < ast_item_t* > () = yystack_[0].value.as < ast_item_t* > (); }
#line 954 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 34: // add_expr: add_expr "+" mul_expr
#line 170 "src/iec61131.y"
                              { yylhs.value.as < ast_item_t* > () = new ast_binary_t("sum", yystack_[2].value.as < ast_item_t* > (), yystack_[0].value.as < ast_item_t* > ()); yystack_[2].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); yystack_[0].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); }
#line 960 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 35: // add_expr: add_expr "-" mul_expr
#line 171 "src/iec61131.y"
                              { yylhs.value.as < ast_item_t* > () = new ast_binary_t("sub", yystack_[2].value.as < ast_item_t* > (), yystack_[0].value.as < ast_item_t* > ()); yystack_[2].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); yystack_[0].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); }
#line 966 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 36: // mul_expr: pow_expr
#line 175 "src/iec61131.y"
                              { yylhs.value.as < ast_item_t* > () = yystack_[0].value.as < ast_item_t* > (); }
#line 972 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 37: // mul_expr: mul_expr "*" pow_expr
#line 176 "src/iec61131.y"
                              { yylhs.value.as < ast_item_t* > () = new ast_binary_t("mul", yystack_[2].value.as < ast_item_t* > (), yystack_[0].value.as < ast_item_t* > ()); yystack_[2].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); yystack_[0].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); }
#line 978 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 38: // mul_expr: mul_expr "mod" pow_expr
#line 177 "src/iec61131.y"
                              { yylhs.value.as < ast_item_t* > () = new ast_binary_t("mod", yystack_[2].value.as < ast_item_t* > (), yystack_[0].value.as < ast_item_t* > ()); yystack_[2].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); yystack_[0].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); }
#line 984 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 39: // mul_expr: mul_expr "/" pow_expr
#line 178 "src/iec61131.y"
                              { yylhs.value.as < ast_item_t* > () = new ast_binary_t("div", yystack_[2].value.as < ast_item_t* > (), yystack_[0].value.as < ast_item_t* > ()); yystack_[2].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); yystack_[0].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); }
#line 990 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 40: // pow_expr: unary_expr
#line 182 "src/iec61131.y"
                             { yylhs.value.as < ast_item_t* > () = yystack_[0].value.as < ast_item_t* > (); }
#line 996 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 41: // pow_expr: pow_expr "**" unary_expr
#line 183 "src/iec61131.y"
                             { yylhs.value.as < ast_item_t* > () = new ast_binary_t("pow", yystack_[2].value.as < ast_item_t* > (), yystack_[0].value.as < ast_item_t* > ()); yystack_[2].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); yystack_[0].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); }
#line 1002 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 42: // unary_expr: postfix_expr
#line 187 "src/iec61131.y"
                               { yylhs.value.as < ast_item_t* > () = yystack_[0].value.as < ast_item_t* > (); }
#line 1008 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 43: // unary_expr: "not" unary_expr
#line 188 "src/iec61131.y"
                               { yylhs.value.as < ast_item_t* > () = new ast_unary_t("not", yystack_[0].value.as < ast_item_t* > () ); yystack_[0].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); }
#line 1014 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 44: // unary_expr: "-" unary_expr
#line 189 "src/iec61131.y"
                               { yylhs.value.as < ast_item_t* > () = new ast_unary_t("neg", yystack_[0].value.as < ast_item_t* > () ); yystack_[0].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); }
#line 1020 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 45: // postfix_expr: primary_expr
#line 193 "src/iec61131.y"
                                      { yylhs.value.as < ast_item_t* > () = yystack_[0].value.as < ast_item_t* > (); }
#line 1026 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 46: // postfix_expr: "identifier" "(" ")"
#line 194 "src/iec61131.y"
                                      { yylhs.value.as < ast_item_t* > () = new ast_postfix_t(yystack_[2].value.as < std::string > (), nullptr); }
#line 1032 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 47: // postfix_expr: "identifier" "(" argument_list ")"
#line 195 "src/iec61131.y"
                                      { yylhs.value.as < ast_item_t* > () = new ast_postfix_t(yystack_[3].value.as < std::string > (), yystack_[1].value.as < ast_arg_list_t* > ()); yystack_[1].value.as < ast_arg_list_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); }
#line 1038 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 48: // argument_list: or_expr
#line 199 "src/iec61131.y"
                                     { yylhs.value.as < ast_arg_list_t* > () = new ast_arg_list_t(); yylhs.value.as < ast_arg_list_t* > ()->Append(yystack_[0].value.as < ast_item_t* > ()); yystack_[0].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_arg_list_t* > ()); }
#line 1044 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 49: // argument_list: argument_list "," or_expr
#line 200 "src/iec61131.y"
                                     { yylhs.value.as < ast_arg_list_t* > () = yystack_[2].value.as < ast_arg_list_t* > ();                   yylhs.value.as < ast_arg_list_t* > ()->Append(yystack_[0].value.as < ast_item_t* > ()); yystack_[0].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_arg_list_t* > ()); }
#line 1050 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 50: // primary_expr: "number"
#line 204 "src/iec61131.y"
                              { yylhs.value.as < ast_item_t* > () = new ast_number_t(yystack_[0].value.as < double > ()); }
#line 1056 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 51: // primary_expr: "identifier"
#line 205 "src/iec61131.y"
                              { yylhs.value.as < ast_item_t* > () = new ast_identifier_t(yystack_[0].value.as < std::string > ()); }
#line 1062 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 52: // primary_expr: "(" expression ")"
#line 206 "src/iec61131.y"
                              { yylhs.value.as < ast_item_t* > () = yystack_[1].value.as < ast_item_t* > (); }
#line 1068 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 53: // if_statement: "IF" or_expr "THEN" statement_list "ELSE" statement_list "END_IF"
#line 210 "src/iec61131.y"
                                                                      { yylhs.value.as < ast_item_t* > () = new ast_if_t(yystack_[5].value.as < ast_item_t* > (), yystack_[3].value.as < ast_t* > (),      yystack_[1].value.as < ast_t* > ()); yystack_[5].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); yystack_[3].value.as < ast_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); yystack_[1].value.as < ast_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); }
#line 1074 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 54: // if_statement: "IF" or_expr "THEN" statement_list "END_IF"
#line 211 "src/iec61131.y"
                                                                      { yylhs.value.as < ast_item_t* > () = new ast_if_t(yystack_[3].value.as < ast_item_t* > (), yystack_[1].value.as < ast_t* > (), nullptr); yystack_[3].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); yystack_[1].value.as < ast_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); }
#line 1080 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 55: // for_statement: "FOR" "identifier" ":=" or_expr "TO" or_expr "BY" or_expr "DO" statement_list "END_FOR"
#line 215 "src/iec61131.y"
                                                                                          { yylhs.value.as < ast_item_t* > () = new ast_for_t(yystack_[9].value.as < std::string > (), yystack_[7].value.as < ast_item_t* > (), yystack_[5].value.as < ast_item_t* > (), yystack_[1].value.as < ast_t* > (), yystack_[3].value.as < ast_item_t* > ());     yystack_[7].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); yystack_[5].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); yystack_[3].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); yystack_[1].value.as < ast_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); }
#line 1086 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 56: // for_statement: "FOR" "identifier" ":=" or_expr "TO" or_expr "DO" statement_list "END_FOR"
#line 216 "src/iec61131.y"
                                                                                          { yylhs.value.as < ast_item_t* > () = new ast_for_t(yystack_[7].value.as < std::string > (), yystack_[5].value.as < ast_item_t* > (), yystack_[3].value.as < ast_item_t* > (), yystack_[1].value.as < ast_t* > (), nullptr); yystack_[5].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); yystack_[3].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); yystack_[1].value.as < ast_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); }
#line 1092 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 57: // while_statement: "WHILE" or_expr "DO" statement_list "END_WHILE"
#line 220 "src/iec61131.y"
                                                         { yylhs.value.as < ast_item_t* > () = new ast_while_t(yystack_[3].value.as < ast_item_t* > (), yystack_[1].value.as < ast_t* > ()); yystack_[3].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); yystack_[1].value.as < ast_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); }
#line 1098 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;

  case 58: // repeat_statement: "REPEAT" statement_list "UNTIL" or_expr "END_REPEAT"
#line 224 "src/iec61131.y"
                                                         { yylhs.value.as < ast_item_t* > () = new ast_repeat_t(yystack_[1].value.as < ast_item_t* > (), yystack_[3].value.as < ast_t* > ()); yystack_[3].value.as < ast_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); yystack_[1].value.as < ast_item_t* > ()->Parent(yylhs.value.as < ast_item_t* > ()); }
#line 1104 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"
    break;


#line 1108 "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.cpp"

            default:
              break;
            }
        }
#if YY_EXCEPTIONS
      catch (const syntax_error& yyexc)
        {
          YYCDEBUG << "Caught exception: " << yyexc.what() << '\n';
          error (yyexc);
          YYERROR;
        }
#endif // YY_EXCEPTIONS
      YY_SYMBOL_PRINT ("-> $$ =", yylhs);
      yypop_ (yylen);
      yylen = 0;

      // Shift the result of the reduction.
      yypush_ (YY_NULLPTR, YY_MOVE (yylhs));
    }
    goto yynewstate;


  /*--------------------------------------.
  | yyerrlab -- here on detecting error.  |
  `--------------------------------------*/
  yyerrlab:
    // If not already recovering from an error, report this error.
    if (!yyerrstatus_)
      {
        ++yynerrs_;
        context yyctx (*this, yyla);
        std::string msg = yysyntax_error_ (yyctx);
        error (yyla.location, YY_MOVE (msg));
      }


    yyerror_range[1].location = yyla.location;
    if (yyerrstatus_ == 3)
      {
        /* If just tried and failed to reuse lookahead token after an
           error, discard it.  */

        // Return failure if at end of input.
        if (yyla.kind () == symbol_kind::S_YYEOF)
          YYABORT;
        else if (!yyla.empty ())
          {
            yy_destroy_ ("Error: discarding", yyla);
            yyla.clear ();
          }
      }

    // Else will try to reuse lookahead token after shifting the error token.
    goto yyerrlab1;


  /*---------------------------------------------------.
  | yyerrorlab -- error raised explicitly by YYERROR.  |
  `---------------------------------------------------*/
  yyerrorlab:
    /* Pacify compilers when the user code never invokes YYERROR and
       the label yyerrorlab therefore never appears in user code.  */
    if (false)
      YYERROR;

    /* Do not reclaim the symbols of the rule whose action triggered
       this YYERROR.  */
    yypop_ (yylen);
    yylen = 0;
    YY_STACK_PRINT ();
    goto yyerrlab1;


  /*-------------------------------------------------------------.
  | yyerrlab1 -- common code for both syntax error and YYERROR.  |
  `-------------------------------------------------------------*/
  yyerrlab1:
    yyerrstatus_ = 3;   // Each real token shifted decrements this.
    // Pop stack until we find a state that shifts the error token.
    for (;;)
      {
        yyn = yypact_[+yystack_[0].state];
        if (!yy_pact_value_is_default_ (yyn))
          {
            yyn += symbol_kind::S_YYerror;
            if (0 <= yyn && yyn <= yylast_
                && yycheck_[yyn] == symbol_kind::S_YYerror)
              {
                yyn = yytable_[yyn];
                if (0 < yyn)
                  break;
              }
          }

        // Pop the current state because it cannot handle the error token.
        if (yystack_.size () == 1)
          YYABORT;

        yyerror_range[1].location = yystack_[0].location;
        yy_destroy_ ("Error: popping", yystack_[0]);
        yypop_ ();
        YY_STACK_PRINT ();
      }
    {
      stack_symbol_type error_token;

      yyerror_range[2].location = yyla.location;
      YYLLOC_DEFAULT (error_token.location, yyerror_range, 2);

      // Shift the error token.
      error_token.state = state_type (yyn);
      yypush_ ("Shifting", YY_MOVE (error_token));
    }
    goto yynewstate;


  /*-------------------------------------.
  | yyacceptlab -- YYACCEPT comes here.  |
  `-------------------------------------*/
  yyacceptlab:
    yyresult = 0;
    goto yyreturn;


  /*-----------------------------------.
  | yyabortlab -- YYABORT comes here.  |
  `-----------------------------------*/
  yyabortlab:
    yyresult = 1;
    goto yyreturn;


  /*-----------------------------------------------------.
  | yyreturn -- parsing is finished, return the result.  |
  `-----------------------------------------------------*/
  yyreturn:
    if (!yyla.empty ())
      yy_destroy_ ("Cleanup: discarding lookahead", yyla);

    /* Do not reclaim the symbols of the rule whose action triggered
       this YYABORT or YYACCEPT.  */
    yypop_ (yylen);
    YY_STACK_PRINT ();
    while (1 < yystack_.size ())
      {
        yy_destroy_ ("Cleanup: popping", yystack_[0]);
        yypop_ ();
      }

    return yyresult;
  }
#if YY_EXCEPTIONS
    catch (...)
      {
        YYCDEBUG << "Exception caught: cleaning lookahead and stack\n";
        // Do not try to display the values of the reclaimed symbols,
        // as their printers might throw an exception.
        if (!yyla.empty ())
          yy_destroy_ (YY_NULLPTR, yyla);

        while (1 < yystack_.size ())
          {
            yy_destroy_ (YY_NULLPTR, yystack_[0]);
            yypop_ ();
          }
        throw;
      }
#endif // YY_EXCEPTIONS
  }